

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

void __thiscall testing::internal::DeathTestImpl::~DeathTestImpl(DeathTestImpl *this)

{
  undefined8 *puVar1;
  _Atomic_word *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  size_type *psVar9;
  ulong uVar10;
  undefined8 uVar11;
  undefined8 *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  int local_b4;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  undefined8 *local_30 [2];
  undefined8 local_20;
  undefined **ppuStack_18;
  
  (this->super_DeathTest)._vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_001cbfe8;
  if (this->read_fd_ == -1) {
    (this->matcher_).
    super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001cc318;
    p_Var3 = (this->matcher_).
             super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             .impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
    ppuStack_18 = &PTR__MatcherBase_001cc318;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = &p_Var3->_M_use_count;
      iVar4 = *p_Var2;
      *p_Var2 = *p_Var2 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var3->_M_use_count;
      p_Var3->_M_use_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      local_20 = 0x13f879;
      (*p_Var3->_vptr__Sp_counted_base[2])(p_Var3);
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2 = &p_Var3->_M_weak_count;
        iVar4 = *p_Var2;
        *p_Var2 = *p_Var2 + -1;
        UNLOCK();
      }
      else {
        iVar4 = p_Var3->_M_weak_count;
        p_Var3->_M_weak_count = iVar4 + -1;
      }
      if (iVar4 == 1) {
        (*p_Var3->_vptr__Sp_counted_base[3])(p_Var3);
        return;
      }
    }
    return;
  }
  local_30[0] = &local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"CHECK failed: File ","");
  plVar5 = (long *)std::__cxx11::string::append((char *)local_30);
  local_90 = (long *)*plVar5;
  plVar7 = plVar5 + 2;
  if (local_90 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar7;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_d8 = (ulong *)*plVar5;
  puVar8 = (ulong *)(plVar5 + 2);
  if (local_d8 == puVar8) {
    local_c8 = *puVar8;
    lStack_c0 = plVar5[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar8;
  }
  local_d0 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_b4 = 0x199;
  StreamableToString<int>(&local_b0,&local_b4);
  uVar10 = 0xf;
  if (local_d8 != &local_c8) {
    uVar10 = local_c8;
  }
  if (uVar10 < local_b0._M_string_length + local_d0) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar11 = local_b0.field_2._M_allocated_capacity;
    }
    if (local_b0._M_string_length + local_d0 <= (ulong)uVar11) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d8);
      goto LAB_0013dbb3;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b0._M_dataplus._M_p);
LAB_0013dbb3:
  local_f8 = (undefined8 *)*puVar6;
  puVar1 = puVar6 + 2;
  if (local_f8 == puVar1) {
    local_e8 = *puVar1;
    uStack_e0 = puVar6[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *puVar1;
  }
  local_f0 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_70 = (long *)*plVar5;
  plVar7 = plVar5 + 2;
  if (local_70 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_50._M_dataplus._M_p = (pointer)*plVar5;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_50._M_dataplus._M_p == psVar9) {
    local_50.field_2._M_allocated_capacity = *psVar9;
    local_50.field_2._8_8_ = plVar5[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar9;
  }
  local_50._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  DeathTestAbort(&local_50);
}

Assistant:

~DeathTestImpl() override { GTEST_DEATH_TEST_CHECK_(read_fd_ == -1); }